

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dev_data.c
# Opt level: O3

void AnalysisRemoteData(serial_frame_t *pFrame)

{
  uint8_t *puVar1;
  
  puVar1 = pFrame->pdata;
  RemoteData.Joystick_LX = (int)(char)*puVar1;
  RemoteData.Joystick_LY = (int)(char)puVar1[1];
  RemoteData.Joystick_RX = (int)(char)puVar1[2];
  RemoteData.Joystick_RY = (int)(char)puVar1[3];
  RemoteData.Gait = (uint)puVar1[4];
  RemoteData.Coordinate = (uint)puVar1[5];
  RemoteData.Dial = puVar1[6];
  return;
}

Assistant:

void AnalysisRemoteData(serial_frame_t *pFrame)
{
	RemoteData.Joystick_LX = (int8_t)pFrame->pdata[0];
	RemoteData.Joystick_LY = (int8_t)pFrame->pdata[1];
	RemoteData.Joystick_RX = (int8_t)pFrame->pdata[2];
	RemoteData.Joystick_RY = (int8_t)pFrame->pdata[3];
	RemoteData.Gait = pFrame->pdata[4];
	RemoteData.Coordinate = pFrame->pdata[5];
	RemoteData.Dial = pFrame->pdata[6];
}